

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O2

_Bool Hacl_P256_ecdsa_verif_p256_sha2
                (uint32_t msg_len,uint8_t *msg,uint8_t *public_key,uint8_t *signature_r,
                uint8_t *signature_s)

{
  _Bool _Var1;
  uint8_t mHash [32];
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  Hacl_Hash_SHA2_hash_256((uint8_t *)&local_68,msg,msg_len);
  local_48 = uStack_50 >> 0x38 | (uStack_50 & 0xff000000000000) >> 0x28 |
             (uStack_50 & 0xff0000000000) >> 0x18 | (uStack_50 & 0xff00000000) >> 8 |
             (uStack_50 & 0xff000000) << 8 | (uStack_50 & 0xff0000) << 0x18 |
             (uStack_50 & 0xff00) << 0x28 | uStack_50 << 0x38;
  local_40 = local_58 >> 0x38 | (local_58 & 0xff000000000000) >> 0x28 |
             (local_58 & 0xff0000000000) >> 0x18 | (local_58 & 0xff00000000) >> 8 |
             (local_58 & 0xff000000) << 8 | (local_58 & 0xff0000) << 0x18 |
             (local_58 & 0xff00) << 0x28 | local_58 << 0x38;
  local_38 = uStack_60 >> 0x38 | (uStack_60 & 0xff000000000000) >> 0x28 |
             (uStack_60 & 0xff0000000000) >> 0x18 | (uStack_60 & 0xff00000000) >> 8 |
             (uStack_60 & 0xff000000) << 8 | (uStack_60 & 0xff0000) << 0x18 |
             (uStack_60 & 0xff00) << 0x28 | uStack_60 << 0x38;
  local_30 = local_68 >> 0x38 | (local_68 & 0xff000000000000) >> 0x28 |
             (local_68 & 0xff0000000000) >> 0x18 | (local_68 & 0xff00000000) >> 8 |
             (local_68 & 0xff000000) << 8 | (local_68 & 0xff0000) << 0x18 |
             (local_68 & 0xff00) << 0x28 | local_68 << 0x38;
  qmod_short(&local_48,&local_48);
  _Var1 = ecdsa_verify_msg_as_qelem(&local_48,public_key,signature_r,signature_s);
  return _Var1;
}

Assistant:

bool
Hacl_P256_ecdsa_verif_p256_sha2(
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[32U] = { 0U };
  Hacl_Hash_SHA2_hash_256(mHash, msg, msg_len);
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_verify_msg_as_qelem(m_q, public_key, signature_r, signature_s);
  return res;
}